

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::setCurrentDocument(Input *this)

{
  bool bVar1;
  pointer this_00;
  unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_> *this_01;
  pointer this_02;
  pointer pHVar2;
  error_code eVar3;
  undefined1 local_48 [40];
  Node *N;
  Input *local_18;
  Input *this_local;
  
  local_18 = this;
  this_00 = std::unique_ptr<llvm::yaml::Stream,_std::default_delete<llvm::yaml::Stream>_>::
            operator->(&this->Strm);
  N = (Node *)yaml::Stream::end(this_00);
  bVar1 = document_iterator::operator!=(&this->DocIterator,(document_iterator *)&N);
  if (bVar1) {
    this_01 = document_iterator::operator->(&this->DocIterator);
    this_02 = std::unique_ptr<llvm::yaml::Document,_std::default_delete<llvm::yaml::Document>_>::
              operator->(this_01);
    local_48._32_8_ = Document::getRoot(this_02);
    if ((Node *)local_48._32_8_ == (Node *)0x0) {
      eVar3 = make_error_code(invalid_argument);
      *(ulong *)&this->EC = CONCAT44(local_48._20_4_,eVar3._M_value);
      (this->EC)._M_cat = eVar3._M_cat;
      this_local._7_1_ = false;
    }
    else {
      bVar1 = isa<llvm::yaml::NullNode,llvm::yaml::Node*>((Node **)(local_48 + 0x20));
      if (bVar1) {
        local_48._8_8_ = document_iterator::operator++(&this->DocIterator);
        this_local._7_1_ = setCurrentDocument(this);
      }
      else {
        createHNodes((Input *)local_48,(Node *)this);
        std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
        operator=(&this->TopNode,
                  (unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                   *)local_48);
        std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>::
        ~unique_ptr((unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                     *)local_48);
        pHVar2 = std::
                 unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>
                 ::get(&this->TopNode);
        this->CurrentNode = pHVar2;
        this_local._7_1_ = true;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Input::setCurrentDocument() {
  if (DocIterator != Strm->end()) {
    Node *N = DocIterator->getRoot();
    if (!N) {
      EC = make_error_code(errc::invalid_argument);
      return false;
    }

    if (isa<NullNode>(N)) {
      // Empty files are allowed and ignored
      ++DocIterator;
      return setCurrentDocument();
    }
    TopNode = createHNodes(N);
    CurrentNode = TopNode.get();
    return true;
  }
  return false;
}